

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relative.cpp
# Opt level: O1

string * fs_relative_to_abi_cxx11_(string_view base,string_view other)

{
  string_view path2;
  string_view path1;
  size_t in_RCX;
  char *in_RDX;
  size_t in_RSI;
  string *in_RDI;
  char *in_R8;
  string_view fname;
  string_view in;
  error_code ec;
  string r;
  allocator<char> local_e1;
  error_code local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  path local_90;
  path local_68;
  path local_40;
  
  local_e0._M_value = 0;
  local_b0._M_len = in_RCX;
  local_b0._M_str = in_R8;
  local_a0._M_len = in_RSI;
  local_a0._M_str = in_RDX;
  local_e0._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_68,&local_b0,auto_format);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_90,&local_a0,auto_format);
  std::filesystem::relative(&local_40,&local_68,(error_code *)&local_90);
  std::filesystem::__cxx11::path::generic_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_d0,&local_40,&local_e1);
  std::filesystem::__cxx11::path::~path(&local_40);
  std::filesystem::__cxx11::path::~path(&local_90);
  std::filesystem::__cxx11::path::~path(&local_68);
  if (local_e0._M_value == 0) {
    in._M_str = local_d0._M_dataplus._M_p;
    in._M_len = local_d0._M_string_length;
    fs_drop_slash_abi_cxx11_(in_RDI,in);
  }
  else {
    path1._M_str = local_a0._M_str;
    path1._M_len = local_a0._M_len;
    path2._M_str = local_b0._M_str;
    path2._M_len = local_b0._M_len;
    fname._M_str = "fs_relative_to";
    fname._M_len = 0xe;
    fs_print_error(path1,path2,fname,&local_e0);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return in_RDI;
}

Assistant:

std::string fs_relative_to(std::string_view base, std::string_view other)
{
  // find relative path from base to other
  // "base" and "other" are treated as weakly canonical paths

  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM
  std::string r = std::filesystem::relative(other, base, ec).generic_string();
  // this implements
  // std::filesystem::weakly_canonical(other, ec).lexically_relative(std::filesystem::weakly_canonical(base, ec)).generic_string();
  if(!ec)
    return fs_drop_slash(r);
#else
   ec = std::make_error_code(std::errc::function_not_supported);
#endif

  fs_print_error(base, other, __func__, ec);
  return {};
}